

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  int i;
  Status stat;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  pointer pnVar2;
  int iVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  pointer pnVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar10 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->theCoPvec->thedelta);
  pUVar1 = this->theCoPvec;
  leavetol(&local_b0,this);
  (this->updateViols).super_IdxSet.num = 0;
  lVar8 = (long)(pUVar1->thedelta).super_IdxSet.num;
  if (0 < lVar8) {
    this_00 = &this->m_pricingViol;
    uVar9 = lVar8 + 1;
    do {
      i = (pUVar1->thedelta).super_IdxSet.idx[uVar9 - 2];
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.costat)->data[i];
      if (this->theRep * stat < 1) {
        if (this->m_pricingViolUpToDate == true) {
          pcVar7 = &(this->theCoTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
          pnVar5 = &local_b0;
          pcVar4 = &local_130;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar4->data)._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
            pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar5 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar10 * -8 + 4);
          }
          local_130.exp = local_b0.m_backend.exp;
          local_130.neg = local_b0.m_backend.neg;
          local_130.fpclass = local_b0.m_backend.fpclass;
          local_130.prec_elem = local_b0.m_backend.prec_elem;
          if (local_130.data._M_elems[0] != 0 || local_b0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_130.neg = (bool)(local_b0.m_backend.neg ^ 1);
          }
          if (((local_b0.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar7->fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar7,&local_130), iVar3 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&this_00->m_backend,
                       &(this->theCoTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          }
        }
        coTest((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_130,this,i,stat);
        pnVar2 = (this->theCoTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = &local_130;
        pnVar6 = pnVar2 + i;
        for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pnVar6->m_backend).data._M_elems[0] = (pcVar4->data)._M_elems[0];
          pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar10 * -8 + 4);
          pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
        }
        pnVar2[i].m_backend.exp = local_130.exp;
        pnVar2[i].m_backend.neg = local_130.neg;
        pnVar2[i].m_backend.fpclass = local_130.fpclass;
        pnVar2[i].m_backend.prec_elem = local_130.prec_elem;
        pcVar4 = &(this->theCoTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
        if (this->sparsePricingEnter == true) {
          pnVar5 = &local_b0;
          pcVar7 = &local_130;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar7->data)._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
            pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar5 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
          }
          local_130.exp = local_b0.m_backend.exp;
          local_130.neg = local_b0.m_backend.neg;
          local_130.fpclass = local_b0.m_backend.fpclass;
          local_130.prec_elem = local_b0.m_backend.prec_elem;
          if (local_130.data._M_elems[0] != 0 || local_b0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_130.neg = (bool)(local_b0.m_backend.neg ^ 1);
          }
          if (((local_b0.m_backend.fpclass == cpp_dec_float_NaN) ||
              (pcVar4->fpclass == cpp_dec_float_NaN)) ||
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar4,&local_130), -1 < iVar3)) {
            (this->isInfeasible).data[i] = 0;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theCoTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
            if ((this->isInfeasible).data[i] == 0) {
              DIdxSet::addIdx(&this->infeasibilities,i);
              (this->isInfeasible).data[i] = 1;
            }
            if (this->hyperPricingEnter == true) {
              DIdxSet::addIdx(&this->updateViols,i);
            }
          }
        }
        else {
          pnVar5 = &local_b0;
          pcVar7 = &local_130;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar7->data)._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
            pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar5 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar10 * -8 + 4);
          }
          local_130.exp = local_b0.m_backend.exp;
          local_130.neg = local_b0.m_backend.neg;
          local_130.fpclass = local_b0.m_backend.fpclass;
          local_130.prec_elem = local_b0.m_backend.prec_elem;
          if (local_130.data._M_elems[0] != 0 || local_b0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_130.neg = (bool)(local_b0.m_backend.neg ^ 1);
          }
          if (((local_b0.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar4->fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar4,&local_130), iVar3 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theCoTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          }
        }
      }
      else {
        (this->isInfeasible).data[i] = 0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(this->theCoTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateCoTest()
{
   theCoPvec->delta().setup();

   const IdxSet& idx = theCoPvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViols.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolUpToDate && theCoTest[j] < -pricingTol)
            m_pricingViol += theCoTest[j];

         theCoTest[j] = coTest(j, stat);

         if(sparsePricingEnter)
         {
            if(theCoTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnter == 0);
               m_pricingViol -= theCoTest[j];

               if(isInfeasible[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  //                if( !hyperPricingEnter )
                  infeasibilities.addIdx(j);
                  isInfeasible[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViols.addIdx(j);
            }
            else
            {
               // @todo do we need to remove index j from infeasibilitiesCo?
               isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theCoTest[j] < -pricingTol)
            m_pricingViol -= theCoTest[j];
      }
      else
      {
         isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
         theCoTest[j] = 0;
      }
   }
}